

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageReadWrite
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  DiagnosticStream DStack_1f8;
  
  if (info->sampled == 0) {
    return SPV_SUCCESS;
  }
  if (info->sampled == 2) {
    if ((info->dim != Dim1D) ||
       (bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImage1D),
       bVar1)) {
      if ((info->dim != DimRect) ||
         (bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImageRect),
         bVar1)) {
        if ((info->dim != Buffer) ||
           (bVar1 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityImageBuffer), bVar1)) {
          if (((info->dim != Cube) || (info->arrayed != 1)) ||
             (bVar1 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,CapabilityImageCubeArray), bVar1)) {
            if (info->multisampled != 1) {
              return SPV_SUCCESS;
            }
            if (info->arrayed != 1) {
              return SPV_SUCCESS;
            }
            if (info->sampled != 2) {
              return SPV_SUCCESS;
            }
            bVar1 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityImageMSArray);
            if (bVar1) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&DStack_1f8,
                       "Capability ImageMSArray is required to access storage ",0x36);
            pcVar3 = "image";
            lVar2 = 5;
          }
          else {
            ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&DStack_1f8,"Capability ImageCubeArray is required to access ",
                       0x30);
            pcVar3 = "storage image";
            lVar2 = 0xd;
          }
        }
        else {
          ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar3 = "Capability ImageBuffer is required to access storage image";
          lVar2 = 0x3a;
        }
      }
      else {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar3 = "Capability ImageRect is required to access storage image";
        lVar2 = 0x38;
      }
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar3 = "Capability Image1D is required to access storage image";
      lVar2 = 0x36;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Expected Image \'Sampled\' parameter to be 0 or 2";
    lVar2 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar3,lVar2);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateImageReadWrite(ValidationState_t& _,
                                    const Instruction* inst,
                                    const ImageTypeInfo& info) {
  if (info.sampled == 2) {
    if (info.dim == spv::Dim::Dim1D &&
        !_.HasCapability(spv::Capability::Image1D)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability Image1D is required to access storage image";
    } else if (info.dim == spv::Dim::Rect &&
               !_.HasCapability(spv::Capability::ImageRect)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageRect is required to access storage image";
    } else if (info.dim == spv::Dim::Buffer &&
               !_.HasCapability(spv::Capability::ImageBuffer)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageBuffer is required to access storage image";
    } else if (info.dim == spv::Dim::Cube && info.arrayed == 1 &&
               !_.HasCapability(spv::Capability::ImageCubeArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageCubeArray is required to access "
             << "storage image";
    }

    if (info.multisampled == 1 && info.arrayed == 1 && info.sampled == 2 &&
        !_.HasCapability(spv::Capability::ImageMSArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageMSArray is required to access storage "
             << "image";
    }
  } else if (info.sampled != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'Sampled' parameter to be 0 or 2";
  }

  return SPV_SUCCESS;
}